

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::OffsetIndex::OffsetIndex(OffsetIndex *this,OffsetIndex *other172)

{
  *(undefined ***)this = &PTR__OffsetIndex_027dca58;
  (this->page_locations).
  super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->page_locations).
  super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->page_locations).
  super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  this->__isset = (_OffsetIndex__isset)((byte)this->__isset & 0xfe);
  std::vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>::
  operator=(&(this->page_locations).
             super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
            ,&(other172->page_locations).
              super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
           );
  std::vector<long,_std::allocator<long>_>::operator=
            (&(this->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>,
             &(other172->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>)
  ;
  this->__isset = other172->__isset;
  return;
}

Assistant:

OffsetIndex::OffsetIndex(const OffsetIndex& other172) {
  page_locations = other172.page_locations;
  unencoded_byte_array_data_bytes = other172.unencoded_byte_array_data_bytes;
  __isset = other172.__isset;
}